

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O3

void duckdb::ListAggregateFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  idx_t count;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar1;
  undefined1 auVar2 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  reference vec;
  BoundFunctionExpression *pBVar5;
  pointer pFVar6;
  pointer pEVar7;
  BoundAggregateExpression *pBVar8;
  idx_t iVar9;
  Vector *this_00;
  ulong uVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  _Head_base<0UL,_unsigned_long_*,_false> _Var12;
  data_ptr_t pdVar13;
  idx_t idx_in_entry;
  ulong uVar14;
  idx_t child_idx;
  ulong uVar15;
  long *plVar16;
  ArenaAllocator *this_01;
  idx_t count_00;
  SelectionVector sel_vector;
  AggregateInputData aggr_input_data;
  Vector slice;
  UnifiedVectorFormat lists_data;
  Vector state_vector_update;
  UnifiedVectorFormat child_data;
  StateVector state_vector;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_2a0;
  void *local_298;
  Vector *local_290;
  DataChunk *local_288;
  buffer_ptr<ValidityBuffer> *local_280;
  data_ptr_t local_278;
  idx_t local_270;
  data_ptr_t local_268;
  AggregateFunction *local_260;
  SelectionVector local_258;
  AggregateInputData local_240;
  idx_t local_228;
  LogicalType local_220;
  undefined1 local_208 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *ap_Stack_200 [6];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a8;
  UnifiedVectorFormat local_1a0;
  Vector local_158;
  UnifiedVectorFormat local_f0;
  StateVector local_a8;
  
  count = args->count;
  vec = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  Vector::SetVectorType(result,FLAT_VECTOR);
  FlatVector::VerifyFlatVector(result);
  if ((vec->type).id_ != SQLNULL) {
    pBVar5 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                       (&state->expr->super_BaseExpression);
    pFVar6 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
             operator->(&pBVar5->bind_info);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)(pFVar6 + 4));
    pBVar8 = BaseExpression::Cast<duckdb::BoundAggregateExpression>(&pEVar7->super_BaseExpression);
    local_a8.count = (idx_t)state[1]._vptr_ExpressionState;
    optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid
              ((optional_ptr<duckdb::FunctionLocalState,_true> *)&local_a8);
    this_01 = (ArenaAllocator *)(local_a8.count + 8);
    ArenaAllocator::Reset(this_01);
    local_240.bind_data.ptr =
         (pBVar8->bind_info).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    local_240.combine_type = PRESERVE_INPUT;
    local_240.allocator = this_01;
    iVar9 = ListVector::GetListSize(vec);
    this_00 = ListVector::GetEntry(vec);
    Vector::Flatten(this_00,iVar9);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_f0);
    local_290 = this_00;
    Vector::ToUnifiedFormat(this_00,iVar9,&local_f0);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_1a0);
    Vector::ToUnifiedFormat(vec,count,&local_1a0);
    local_278 = local_1a0.data;
    local_260 = &pBVar8->function;
    iVar9 = (*(pBVar8->function).state_size)(local_260);
    local_298 = operator_new__(iVar9 * count);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)(pFVar6 + 4));
    (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_2a0,pEVar7);
    StateVector::StateVector
              (&local_a8,count,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_2a0);
    if (local_2a0._M_head_impl != (Expression *)0x0) {
      (*((local_2a0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_2a0._M_head_impl = (Expression *)0x0;
    local_268 = local_a8.state_vector.data;
    LogicalType::LogicalType(&local_220,POINTER);
    local_288 = args;
    Vector::Vector(&local_158,&local_220,0x800);
    LogicalType::~LogicalType(&local_220);
    SelectionVector::SelectionVector(&local_258,0x800);
    if (count != 0) {
      local_280 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      count_00 = 0;
      uVar14 = 0;
      local_270 = iVar9;
      do {
        pdVar13 = (data_ptr_t)(uVar14 * local_270 + (long)local_298);
        *(data_ptr_t *)(local_268 + uVar14 * 8) = pdVar13;
        (*(pBVar8->function).initialize)(local_260,pdVar13);
        uVar15 = uVar14;
        if ((local_1a0.sel)->sel_vector != (sel_t *)0x0) {
          uVar15 = (ulong)(local_1a0.sel)->sel_vector[uVar14];
        }
        if ((local_1a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_1a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [uVar15 >> 6] >> (uVar15 & 0x3f) & 1) != 0)) {
          plVar16 = (long *)(local_278 + uVar15 * 0x10);
          if (plVar16[1] != 0) {
            uVar15 = 0;
            do {
              if (count_00 == 0x800) {
                Vector::Vector((Vector *)local_208,local_290,&local_258,0x800);
                (*(pBVar8->function).update)((Vector *)local_208,&local_240,1,&local_158,0x800);
                if (local_1a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8._M_pi);
                }
                if (local_1b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b8._M_pi);
                }
                if (local_1d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0._M_pi);
                }
                LogicalType::~LogicalType((LogicalType *)ap_Stack_200);
                count_00 = 0;
              }
              uVar10 = *plVar16 + uVar15;
              if ((local_f0.sel)->sel_vector != (sel_t *)0x0) {
                uVar10 = (ulong)(local_f0.sel)->sel_vector[uVar10];
              }
              local_258.sel_vector[count_00] = (sel_t)uVar10;
              *(data_ptr_t *)(local_158.data + count_00 * 8) = pdVar13;
              count_00 = count_00 + 1;
              uVar15 = uVar15 + 1;
            } while (uVar15 < (ulong)plVar16[1]);
          }
        }
        else {
          _Var12._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (_Var12._M_head_impl == (unsigned_long *)0x0) {
            local_228 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)local_208,&local_228);
            p_Var3 = ap_Stack_200[0];
            auVar2 = local_208;
            local_208 = (undefined1  [8])0x0;
            ap_Stack_200[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)auVar2;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var3;
            if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
               ap_Stack_200[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(ap_Stack_200[0]);
            }
            pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_280);
            _Var12._M_head_impl =
                 (pTVar11->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var12._M_head_impl;
          }
          bVar1 = (byte)uVar14 & 0x3f;
          _Var12._M_head_impl[uVar14 >> 6] =
               _Var12._M_head_impl[uVar14 >> 6] &
               (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != count);
      if (count_00 != 0) {
        Vector::Vector((Vector *)local_208,local_290,&local_258,count_00);
        (*(pBVar8->function).update)((Vector *)local_208,&local_240,1,&local_158,count_00);
        if (local_1a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8._M_pi);
        }
        if (local_1b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b8._M_pi);
        }
        if (local_1d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0._M_pi);
        }
        LogicalType::~LogicalType((LogicalType *)ap_Stack_200);
      }
    }
    (*(pBVar8->function).finalize)(&local_a8.state_vector,&local_240,result,count,0);
    bVar4 = DataChunk::AllConstant(local_288);
    if (bVar4) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
    if (local_258.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_258.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_158.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_158.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_158.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_158.type);
    StateVector::~StateVector(&local_a8);
    operator_delete__(local_298);
    if (local_1a0.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1a0.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_1a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_f0.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f0.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    return;
  }
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void ListAggregateFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() >= 2);
	ListAggregatesFunction<AggregateFunctor, true>(args, state, result);
}